

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
::operator<(iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            *this,iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  *other)

{
  value_t vVar1;
  pointer pbVar2;
  invalid_iterator *piVar3;
  bool bVar4;
  string local_40;
  
  pbVar2 = this->m_object;
  if (pbVar2 != other->m_object) {
    piVar3 = (invalid_iterator *)__cxa_allocate_exception(0x20);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"cannot compare iterators of different containers","");
    invalid_iterator::
    create<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_0>
              (piVar3,0xd4,&local_40,this->m_object);
    __cxa_throw(piVar3,&invalid_iterator::typeinfo,exception::~exception);
  }
  if (pbVar2 != (pointer)0x0) {
    vVar1 = (pbVar2->m_data).m_type;
    if (vVar1 == array) {
      bVar4 = (this->m_it).array_iterator._M_current < (other->m_it).array_iterator._M_current;
    }
    else {
      if (vVar1 == object) {
        piVar3 = (invalid_iterator *)__cxa_allocate_exception(0x20);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"cannot compare order of object iterators","");
        invalid_iterator::
        create<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_0>
                  (piVar3,0xd5,&local_40,this->m_object);
        __cxa_throw(piVar3,&invalid_iterator::typeinfo,exception::~exception);
      }
      bVar4 = (this->m_it).primitive_iterator.m_it < (other->m_it).primitive_iterator.m_it;
    }
    return bVar4;
  }
  __assert_fail("m_object != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/pantor[P]inja/third_party/include/nlohmann/json.hpp"
                ,0x344e,
                "bool nlohmann::detail::iter_impl<nlohmann::basic_json<>>::operator<(const iter_impl<BasicJsonType> &) const [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

bool operator<(const iter_impl& other) const
    {
        // if objects are not the same, the comparison is undefined
        if (JSON_HEDLEY_UNLIKELY(m_object != other.m_object))
        {
            JSON_THROW(invalid_iterator::create(212, "cannot compare iterators of different containers", m_object));
        }

        JSON_ASSERT(m_object != nullptr);

        switch (m_object->m_data.m_type)
        {
            case value_t::object:
                JSON_THROW(invalid_iterator::create(213, "cannot compare order of object iterators", m_object));

            case value_t::array:
                return (m_it.array_iterator < other.m_it.array_iterator);

            case value_t::null:
            case value_t::string:
            case value_t::boolean:
            case value_t::number_integer:
            case value_t::number_unsigned:
            case value_t::number_float:
            case value_t::binary:
            case value_t::discarded:
            default:
                return (m_it.primitive_iterator < other.m_it.primitive_iterator);
        }
    }